

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

bool anon_unknown.dwarf_e60ea::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int width,int height)

{
  ostream *poVar1;
  long *plVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  if (0 < height) {
    puVar3 = ph->_data;
    lVar4 = 0;
    uVar5 = 0;
    bVar8 = false;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          uVar7 = ((int)lVar4 + (int)uVar6) % 0x801;
          if (puVar3[uVar6] != uVar7) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,", should be ",0xc);
            plVar2 = (long *)std::ostream::operator<<(poVar1,uVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
            std::ostream::put((char)plVar2);
            std::ostream::flush();
            std::ostream::flush();
            return bVar8;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      bVar8 = height - 1 <= uVar5;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + (ulong)(uint)width;
      puVar3 = puVar3 + ph->_sizeY;
    } while (uVar5 != (uint)height);
  }
  return true;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}